

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTi.cpp
# Opt level: O0

RealType __thiscall OpenMD::NPTi::calcConservedQuantity(NPTi *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  long *in_RDI;
  RealType RVar8;
  double dVar9;
  RealType RVar10;
  RealType barostat_potential;
  RealType barostat_kinetic;
  RealType thermostat_potential;
  RealType thermostat_kinetic;
  RealType Energy;
  RealType conservedQuantity;
  SimInfo *in_stack_ffffffffffffffb0;
  Thermo *this_00;
  Thermo *in_stack_ffffffffffffffc0;
  pair<double,_double> local_18;
  
  local_18 = Snapshot::getThermostat((Snapshot *)in_RDI[0x1c]);
  std::pair<double,_double>::operator=((pair<double,_double> *)(in_RDI + 0x34),&local_18);
  (**(code **)(*in_RDI + 0xc0))();
  iVar7 = SimInfo::getNGlobalIntegrableObjects((SimInfo *)in_RDI[0xe]);
  in_RDI[0x1f] = (long)((double)iVar7 * 8.31451e-07 * (double)in_RDI[0x26]);
  iVar7 = SimInfo::getNdf(in_stack_ffffffffffffffb0);
  in_RDI[0x20] = (long)((double)iVar7 * 8.31451e-07 * (double)in_RDI[0x26]);
  RVar8 = Thermo::getTotalEnergy(in_stack_ffffffffffffffc0);
  dVar1 = (double)in_RDI[0x20];
  dVar2 = (double)in_RDI[0x21];
  dVar3 = (double)in_RDI[0x34];
  dVar4 = (double)in_RDI[0x34];
  dVar5 = (double)in_RDI[0x20];
  dVar6 = (double)in_RDI[0x35];
  dVar9 = ((double)in_RDI[0x1f] * 3.0 * (double)in_RDI[0x22] * (double)in_RDI[0x41] *
          (double)in_RDI[0x41]) / 0.0008368;
  this_00 = (Thermo *)in_RDI[0x27];
  RVar10 = Thermo::getVolume(this_00);
  return RVar8 + (dVar1 * dVar2 * dVar3 * dVar4) / 0.0008368 + (dVar5 * dVar6) / 0.0004184 + dVar9 +
         (((double)this_00 * RVar10) / 163882576.0) / 0.0004184;
}

Assistant:

RealType NPTi::calcConservedQuantity() {
    thermostat = snap->getThermostat();
    loadEta();
    // We need NkBT a lot, so just set it here: This is the RAW number
    // of integrableObjects, so no subtraction or addition of constraints or
    // orientational degrees of freedom:
    NkBT = info_->getNGlobalIntegrableObjects() * Constants::kB * targetTemp;

    // fkBT is used because the thermostat operates on more degrees of freedom
    // than the barostat (when there are particles with orientational degrees
    // of freedom).
    fkBT = info_->getNdf() * Constants::kB * targetTemp;

    RealType conservedQuantity;
    RealType Energy;
    RealType thermostat_kinetic;
    RealType thermostat_potential;
    RealType barostat_kinetic;
    RealType barostat_potential;

    Energy = thermo.getTotalEnergy();

    thermostat_kinetic = fkBT * tt2 * thermostat.first * thermostat.first /
                         (2.0 * Constants::energyConvert);

    thermostat_potential = fkBT * thermostat.second / Constants::energyConvert;

    barostat_kinetic =
        3.0 * NkBT * tb2 * eta * eta / (2.0 * Constants::energyConvert);

    barostat_potential =
        (targetPressure * thermo.getVolume() / Constants::pressureConvert) /
        Constants::energyConvert;

    conservedQuantity = Energy + thermostat_kinetic + thermostat_potential +
                        barostat_kinetic + barostat_potential;

    return conservedQuantity;
  }